

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddAddIte.c
# Opt level: O2

int Cudd_addLeq(DdManager *dd,DdNode *f,DdNode *g)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  DdNode *pDVar4;
  DdNode *g_00;
  DdNode *f_00;
  DdNode *g_01;
  
  if (f == g) {
    return 1;
  }
  if (f->index == 0x7fffffff) {
    if (g->index == 0x7fffffff) {
      return (uint)((f->type).value <= (g->type).value);
    }
    if (dd->minusinfinity == f) {
      return 1;
    }
    pDVar4 = dd->plusinfinity;
    if (pDVar4 == f) {
      return 0;
    }
  }
  else {
    pDVar4 = dd->plusinfinity;
  }
  if (pDVar4 == g) {
    return 1;
  }
  if (dd->minusinfinity == g) {
    return 0;
  }
  pDVar4 = cuddCacheLookup2(dd,Cudd_addLeq,f,g);
  if (pDVar4 == (DdNode *)0x0) {
    uVar1 = 0x7fffffff;
    uVar3 = 0x7fffffff;
    if ((ulong)f->index != 0x7fffffff) {
      uVar3 = dd->perm[f->index];
    }
    if ((ulong)g->index != 0x7fffffff) {
      uVar1 = dd->perm[g->index];
    }
    f_00 = f;
    pDVar4 = f;
    if (uVar3 <= uVar1) {
      pDVar4 = (f->type).kids.T;
      f_00 = (f->type).kids.E;
    }
    g_00 = g;
    g_01 = g;
    if (uVar1 <= uVar3) {
      g_01 = (g->type).kids.T;
      g_00 = (g->type).kids.E;
    }
    iVar2 = Cudd_addLeq(dd,f_00,g_00);
    if (iVar2 == 0) {
      uVar3 = 0;
    }
    else {
      uVar3 = Cudd_addLeq(dd,pDVar4,g_01);
    }
    cuddCacheInsert2(dd,Cudd_addLeq,f,g,(DdNode *)((ulong)(uVar3 ^ 1) ^ (ulong)dd->one));
    return uVar3;
  }
  return (uint)(pDVar4 == dd->one);
}

Assistant:

int
Cudd_addLeq(
  DdManager * dd,
  DdNode * f,
  DdNode * g)
{
    DdNode *tmp, *fv, *fvn, *gv, *gvn;
    unsigned int topf, topg, res;

    /* Terminal cases. */
    if (f == g) return(1);

    statLine(dd);
    if (cuddIsConstant(f)) {
        if (cuddIsConstant(g)) return(cuddV(f) <= cuddV(g));
        if (f == DD_MINUS_INFINITY(dd)) return(1);
        if (f == DD_PLUS_INFINITY(dd)) return(0); /* since f != g */
    }
    if (g == DD_PLUS_INFINITY(dd)) return(1);
    if (g == DD_MINUS_INFINITY(dd)) return(0); /* since f != g */

    /* Check cache. */
    tmp = cuddCacheLookup2(dd,(DD_CTFP)Cudd_addLeq,f,g);
    if (tmp != NULL) {
        return(tmp == DD_ONE(dd));
    }

    /* Compute cofactors. One of f and g is not constant. */
    topf = cuddI(dd,f->index);
    topg = cuddI(dd,g->index);
    if (topf <= topg) {
        fv = cuddT(f); fvn = cuddE(f);
    } else {
        fv = fvn = f;
    }
    if (topg <= topf) {
        gv = cuddT(g); gvn = cuddE(g);
    } else {
        gv = gvn = g;
    }

    res = Cudd_addLeq(dd,fvn,gvn) && Cudd_addLeq(dd,fv,gv);

    /* Store result in cache and return. */
    cuddCacheInsert2(dd,(DD_CTFP) Cudd_addLeq,f,g,
                     Cudd_NotCond(DD_ONE(dd),res==0));
    return(res);

}